

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 next_scroll;
  bool can_be_fully_visible_y;
  bool can_be_fully_visible_x;
  bool fully_visible_y;
  bool fully_visible_x;
  ImGuiScrollFlags in_flags;
  ImRect window_rect;
  ImGuiContext *g;
  ImVec2 delta_scroll;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  ImGuiWindow *in_stack_ffffffffffffff10;
  undefined3 uVar6;
  undefined4 in_stack_ffffffffffffff3c;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  ImVec2 local_68;
  byte local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  uint local_5c;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  ImGuiContext *pIVar8;
  ImGuiScrollFlags flags_00;
  undefined4 in_stack_ffffffffffffffe0;
  ImVec2 local_8;
  undefined4 uVar7;
  
  pIVar8 = GImGui;
  ImVec2::ImVec2(&local_48,1.0,1.0);
  local_40 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (ImVec2 *)0x4aa852);
  ImVec2::ImVec2(&local_58,1.0,1.0);
  local_50 = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                         (ImVec2 *)0x4aa898);
  local_5c = in_EDX;
  ImRect::ImRect(&local_38,&local_40,&local_50);
  uVar1 = local_5c;
  if (((local_5c & 0x15) == 0) && ((in_RDI->ScrollbarX & 1U) != 0)) {
    uVar1 = local_5c | 1;
  }
  if ((uVar1 & 0x2a) == 0) {
    uVar2 = 2;
    if ((in_RDI->Appearing & 1U) != 0) {
      uVar2 = 0x20;
    }
    uVar1 = uVar2 | uVar1;
  }
  local_b9 = false;
  if (local_38.Min.x <= ((ImVec2 *)&in_RSI->Name)->x) {
    local_b9 = ((ImVec2 *)&in_RSI->ID)->x <= local_38.Max.x;
  }
  local_5d = local_b9;
  local_ba = false;
  if (local_38.Min.y <= ((ImVec2 *)&in_RSI->Name)->y) {
    local_ba = (float)in_RSI->Flags <= local_38.Max.y;
  }
  local_5e = local_ba;
  fVar3 = ImRect::GetWidth((ImRect *)in_RSI);
  fVar5 = (pIVar8->Style).ItemSpacing.x;
  fVar4 = ImRect::GetWidth(&local_38);
  local_bb = true;
  if ((fVar4 < fVar5 + fVar5 + fVar3) && (local_bb = true, in_RDI->AutoFitFramesX < '\x01')) {
    local_bb = (in_RDI->Flags & 0x40U) != 0;
  }
  local_5f = local_bb;
  fVar3 = ImRect::GetHeight((ImRect *)in_RSI);
  fVar5 = (pIVar8->Style).ItemSpacing.y;
  fVar3 = fVar5 + fVar5 + fVar3;
  fVar5 = ImRect::GetHeight(&local_38);
  uVar6 = (undefined3)in_stack_ffffffffffffff3c;
  uVar7 = CONCAT13(1,uVar6);
  if ((fVar5 < fVar3) && (uVar7 = CONCAT13(1,uVar6), in_RDI->AutoFitFramesY < '\x01')) {
    uVar7 = CONCAT13((in_RDI->Flags & 0x40U) != 0,uVar6);
  }
  local_60 = (byte)((uint)uVar7 >> 0x18);
  if (((uVar1 & 1) == 0) || ((local_5d & 1U) != 0)) {
    if ((((uVar1 & 4) != 0) && ((local_5d & 1U) == 0)) || ((uVar1 & 0x10) != 0)) {
      if ((local_5f & 1U) == 0) {
        SetScrollFromPosX(in_RDI,((ImVec2 *)&in_RSI->Name)->x - (in_RDI->Pos).x,0.0);
      }
      else {
        fVar5 = ImFloor((((ImVec2 *)&in_RSI->Name)->x + (float)in_RSI->Flags) * 0.5);
        SetScrollFromPosX(in_RDI,fVar5 - (in_RDI->Pos).x,0.5);
      }
    }
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar8 >> 0x20);
  }
  else if ((((ImVec2 *)&in_RSI->Name)->x < local_38.Min.x) || ((local_5f & 1U) == 0)) {
    SetScrollFromPosX(in_RDI,(((ImVec2 *)&in_RSI->Name)->x - (pIVar8->Style).ItemSpacing.x) -
                             (in_RDI->Pos).x,0.0);
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar8 >> 0x20);
  }
  else {
    if (local_38.Max.x <= ((ImVec2 *)&in_RSI->ID)->x) {
      SetScrollFromPosX(in_RDI,(((ImVec2 *)&in_RSI->ID)->x + (pIVar8->Style).ItemSpacing.x) -
                               (in_RDI->Pos).x,1.0);
    }
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar8 >> 0x20);
  }
  if (((uVar1 & 2) == 0) || ((local_5e & 1U) != 0)) {
    if ((((uVar1 & 8) != 0) && ((local_5e & 1U) == 0)) || ((uVar1 & 0x20) != 0)) {
      if ((local_60 & 1) == 0) {
        SetScrollFromPosY(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                          in_stack_ffffffffffffff08);
      }
      else {
        ImFloor((((ImVec2 *)&in_RSI->Name)->y + (float)in_RSI->Flags) * 0.5);
        SetScrollFromPosY(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                          in_stack_ffffffffffffff08);
      }
    }
  }
  else if ((((ImVec2 *)&in_RSI->Name)->y < local_38.Min.y) || ((local_60 & 1) == 0)) {
    SetScrollFromPosY(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
    ;
  }
  else if (local_38.Max.y <= (float)in_RSI->Flags) {
    SetScrollFromPosY(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
    ;
  }
  local_68 = CalcNextScrollFromScrollTargetAndClamp((ImGuiWindow *)CONCAT44(uVar7,fVar3));
  local_8 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (ImVec2 *)0x4aae44);
  if (((uVar1 & 0x40) == 0) && ((in_RDI->Flags & 0x1000000U) != 0)) {
    if ((local_5c & 0x14) != 0) {
      local_5c = local_5c & 0xffffffea | 1;
    }
    if ((local_5c & 0x28) != 0) {
      local_5c = local_5c & 0xffffffd5 | 2;
    }
    local_88 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (ImVec2 *)0x4aaeed);
    local_90 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (ImVec2 *)0x4aaf09);
    ImRect::ImRect(&local_80,&local_88,&local_90);
    local_70 = ScrollToRectEx(in_RSI,(ImRect *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),flags_00);
    operator+=(&local_8,&local_70);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth() || (window->AutoFitFramesX > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight() || (window->AutoFitFramesY > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        if (can_be_fully_visible_x)
            SetScrollFromPosX(window, ImFloor((item_rect.Min.x + item_rect.Max.y) * 0.5f) - window->Pos.x, 0.5f);
        else
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        if (can_be_fully_visible_y)
            SetScrollFromPosY(window, ImFloor((item_rect.Min.y + item_rect.Max.y) * 0.5f) - window->Pos.y, 0.5f);
        else
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}